

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void loop_body(Vm *vm)

{
  TokenType TVar1;
  
  advance(vm);
  open_scope(vm);
  while ((TVar1 = (vm->compiler).token.type, TVar1 != TOKEN_CLOSE_BRACE && (TVar1 != TOKEN_EOF))) {
    stmt(vm);
  }
  close_scope(vm);
  advance(vm);
  return;
}

Assistant:

static void loop_body(Vm *vm) {
    advance(vm);
    open_scope(vm);
    while (!check(vm, TOKEN_CLOSE_BRACE) && !check(vm, TOKEN_EOF)) {
        stmt(vm);
    }
    close_scope(vm);
    advance(vm);
}